

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O1

void __thiscall options2::options2(options2 *this,uint argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char **ppcVar6;
  char *__end;
  bool bVar7;
  string local_d8;
  allocator local_b2;
  allocator local_b1;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  uint local_84;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this->valid = true;
  this->prec = 0xf;
  local_90 = (string *)&this->Jx;
  local_60 = &(this->Jx).field_2;
  (this->Jx)._M_dataplus._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char_const*>(local_90,"1","");
  local_98 = (string *)&this->Jy;
  local_68 = &(this->Jy).field_2;
  (this->Jy)._M_dataplus._M_p = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>(local_98,"1","");
  local_70 = &(this->Tmin).field_2;
  (this->Tmin)._M_dataplus._M_p = (pointer)local_70;
  (this->Tmin)._M_string_length = 0;
  (this->Tmin).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->Tmax).field_2;
  (this->Tmax)._M_dataplus._M_p = (pointer)local_78;
  (this->Tmax)._M_string_length = 0;
  (this->Tmax).field_2._M_local_buf[0] = '\0';
  local_80 = &(this->dT).field_2;
  (this->dT)._M_dataplus._M_p = (pointer)local_80;
  (this->dT)._M_string_length = 0;
  (this->dT).field_2._M_local_buf[0] = '\0';
  if (argc != 0) {
    if (argc == 1) {
      help_abi_cxx11_(&local_d8,this,*argv);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,local_d8._M_dataplus._M_p,local_d8._M_string_length);
LAB_00129423:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_84 = argc - 2;
      uVar4 = 0;
      local_b0 = (string *)&this->Tmax;
      local_a8 = (string *)&this->Tmin;
      local_a0 = (string *)&this->dT;
      local_58 = (ulong)argc;
      do {
        std::__cxx11::string::string((string *)&local_d8,argv[uVar4 + 1],&local_b1);
        ppcVar6 = argv + (uVar4 + 1);
        iVar2 = std::__cxx11::string::compare((char *)&local_d8);
        if (iVar2 == 0) {
          bVar7 = true;
        }
        else {
          std::__cxx11::string::string((string *)local_50,*ppcVar6,&local_b2);
          iVar2 = std::__cxx11::string::compare((char *)local_50);
          bVar7 = iVar2 == 0;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          help_abi_cxx11_(&local_d8,this,*argv);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          goto LAB_00129423;
        }
        pcVar1 = *ppcVar6;
        uVar5 = (uint)local_58;
        if (*pcVar1 != '-') {
          switch(~uVar4 + uVar5) {
          case 1:
            std::__cxx11::string::operator=(local_98,"1");
            std::__cxx11::string::_M_assign(local_90);
            goto LAB_0012948d;
          case 2:
            std::__cxx11::string::operator=(local_98,pcVar1);
            std::__cxx11::string::_M_assign(local_90);
            uVar4 = uVar4 + 2;
            break;
          case 3:
            std::__cxx11::string::operator=(local_90,pcVar1);
            std::__cxx11::string::operator=(local_98,argv[uVar4 + 2]);
            uVar4 = uVar4 + 3;
            break;
          default:
            help_abi_cxx11_(&local_d8,this,*argv);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_d8._M_dataplus._M_p,local_d8._M_string_length);
            goto LAB_00129423;
          case 5:
            std::__cxx11::string::operator=(local_90,pcVar1);
            std::__cxx11::string::operator=(local_98,argv[uVar4 + 2]);
            std::__cxx11::string::operator=(local_a8,argv[uVar4 + 3]);
            std::__cxx11::string::operator=(local_b0,argv[uVar4 + 4]);
            std::__cxx11::string::operator=(local_a0,argv[uVar4 + 5]);
            return;
          }
          ppcVar6 = argv + uVar4;
LAB_0012948d:
          std::__cxx11::string::operator=(local_a0,*ppcVar6);
          std::__cxx11::string::_M_assign(local_b0);
          std::__cxx11::string::_M_assign(local_a8);
          return;
        }
        if (pcVar1[1] != 'p') {
          help_abi_cxx11_(&local_d8,this,*argv);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          goto LAB_00129423;
        }
        if (local_84 == uVar4) {
          help_abi_cxx11_(&local_d8,this,*argv);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          goto LAB_00129423;
        }
        uVar3 = atoi(argv[uVar4 + 2]);
        this->prec = uVar3;
        uVar3 = uVar4 + 3;
        uVar4 = uVar4 + 2;
      } while (uVar3 < uVar5);
    }
  }
  return;
}

Assistant:

options2(unsigned argc, char *argv[])
      : valid(true), prec(15), Jx("1"), Jy("1") {
    if (argc == 1) {
      std::cerr << help(argv[0]);
      return;
    }
    for (unsigned i = 1; i < argc; ++i) {
      if (std::string(argv[i]) == "-h" || std::string(argv[i]) == "--help") {
        std::cerr << help(argv[0]);
        return;
      }
      switch (argv[i][0]) {
        case '-':
          switch (argv[i][1]) {
            case 'p':
              if (++i == argc) {
                std::cerr << help(argv[0]);
                return;
              }
              prec = atoi(argv[i]);
              break;
            default:
              std::cerr << help(argv[0]);
              return;
          }
          break;
        default:
          switch (argc - i) {
            case 1:
              Jx = Jy = "1";
              Tmin = Tmax = dT = argv[i];
              return;
            case 2:
              Jx = Jy = argv[i];
              Tmin = Tmax = dT = argv[i + 1];
              return;
            case 3:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = Tmax = dT = argv[i + 2];
              return;
            case 5:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = argv[i + 2];
              Tmax = argv[i + 3];
              dT = argv[i + 4];
              return;
            default:
              std::cerr << help(argv[0]);
              return;
          }
      }
    }
  }